

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O0

int __thiscall
websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::init
          (endpoint<websocketpp::config::asio::transport_config> *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  element_type *this_00;
  element_type *__x;
  element_type *h;
  size_t in_RCX;
  error_code eVar2;
  error_code ec;
  tcp_init_handler *in_stack_ffffffffffffff08;
  connection<websocketpp::config::asio::transport_config> *in_stack_ffffffffffffff10;
  connection<websocketpp::config::asio::transport_config> *this_01;
  shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>
  *in_stack_ffffffffffffff18;
  function<void_(std::weak_ptr<void>)> *this_02;
  undefined1 local_b0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  undefined4 uStack_6c;
  _Invoker_type local_60;
  error_category *local_58;
  int local_50;
  EVP_PKEY_CTX local_30 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_20;
  int local_10;
  
  local_20._M_allocated_capacity = (size_type)ctx;
  local_20._8_8_ = this;
  this_00 = std::
            __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2e7925);
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (this_00,0x400,"transport::asio::init",in_RCX);
  std::
  static_pointer_cast<websocketpp::transport::asio::basic_socket::connection,websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>
            (in_stack_ffffffffffffff18);
  local_50 = basic_socket::endpoint::init(&this->super_socket_type,local_30);
  std::shared_ptr<websocketpp::transport::asio::basic_socket::connection>::~shared_ptr
            ((shared_ptr<websocketpp::transport::asio::basic_socket::connection> *)0x2e798f);
  std::error_code::error_code((error_code *)in_stack_ffffffffffffff10);
  std::
  __shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2e79a6);
  eVar2 = connection<websocketpp::config::asio::transport_config>::init_asio
                    ((connection<websocketpp::config::asio::transport_config> *)
                     in_stack_ffffffffffffff70,(io_service_ptr)in_stack_ffffffffffffff68._M_pi);
  local_58 = eVar2._M_cat;
  local_60 = (_Invoker_type)CONCAT44(uStack_6c,eVar2._M_value);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffa0);
  if (bVar1) {
    local_10 = (int)local_60;
  }
  else {
    __x = std::
          __shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2e7a51);
    this_02 = (function<void_(std::weak_ptr<void>)> *)&stack0xffffffffffffff70;
    std::function<void_(std::weak_ptr<void>)>::function
              (this_02,(function<void_(std::weak_ptr<void>)> *)__x);
    connection<websocketpp::config::asio::transport_config>::set_tcp_pre_init_handler
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    std::function<void_(std::weak_ptr<void>)>::~function
              ((function<void_(std::weak_ptr<void>)> *)0x2e7a89);
    h = std::
        __shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2e7a93);
    this_01 = (connection<websocketpp::config::asio::transport_config> *)local_b0;
    std::function<void_(std::weak_ptr<void>)>::function
              (this_02,(function<void_(std::weak_ptr<void>)> *)__x);
    connection<websocketpp::config::asio::transport_config>::set_tcp_post_init_handler
              (this_01,(tcp_init_handler *)h);
    std::function<void_(std::weak_ptr<void>)>::~function
              ((function<void_(std::weak_ptr<void>)> *)0x2e7ac9);
    std::error_code::error_code((error_code *)this_01);
  }
  return local_10;
}

Assistant:

lib::error_code init(transport_con_ptr tcon) {
        m_alog->write(log::alevel::devel, "transport::asio::init");

        // Initialize the connection socket component
        socket_type::init(lib::static_pointer_cast<socket_con_type,
            transport_con_type>(tcon));

        lib::error_code ec;

        ec = tcon->init_asio(m_io_service);
        if (ec) {return ec;}

        tcon->set_tcp_pre_init_handler(m_tcp_pre_init_handler);
        tcon->set_tcp_post_init_handler(m_tcp_post_init_handler);

        return lib::error_code();
    }